

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::iterate
          (OperatorPerformanceCase *this)

{
  TheilSenCalibrator *this_00;
  CaseType CVar1;
  float afVar2 [2];
  pointer pvVar3;
  long lVar4;
  pointer pWVar5;
  TestContext *this_01;
  iterator __position;
  LineParameters LVar6;
  double dVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  pointer pWVar10;
  State SVar11;
  uint uVar12;
  int iVar13;
  deUint64 dVar14;
  deUint64 dVar15;
  ulong uVar16;
  float afVar17 [2];
  float *pfVar18;
  float *pfVar19;
  pointer pWVar20;
  float (*pafVar21) [2];
  long *plVar22;
  SampleBuilder *pSVar23;
  undefined8 *puVar24;
  InternalError *pIVar25;
  TestError *this_02;
  int iVar26;
  vector<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
  *pvVar27;
  float afVar28 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar29;
  TestLog *pTVar30;
  float *pfVar31;
  size_type *psVar32;
  long *plVar33;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  LineParameters *params;
  LineParameters *params_00;
  LineParameters *params_01;
  float *pfVar34;
  IterateResult IVar35;
  ulong uVar36;
  _Alloc_hider _Var37;
  undefined *__n;
  char *pcVar38;
  LogNumber<long> *pLVar39;
  ios_base *this_03;
  int i;
  int iVar40;
  long lVar41;
  ulong uVar42;
  int *piVar43;
  int iVar44;
  WorkloadRecord *this_04;
  OperatorPerformanceCase *pOVar45;
  __normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord_*,_std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>
  __i;
  long lVar46;
  pointer pWVar47;
  bool bVar48;
  float fVar49;
  float fVar50;
  float value;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar51;
  float fVar52;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  records;
  Vec2 mid;
  vector<float,_std::allocator<float>_> perProgramSlopes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> result;
  Vector<float,_2> res;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData;
  ScopedLogSection section;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> leftData_1;
  long local_868;
  float *local_860;
  string local_858;
  OperatorPerformanceCase *local_838;
  string local_830;
  string local_810;
  string local_7f0;
  float *local_7d0;
  string local_7c8;
  string local_7a8;
  string local_788;
  undefined1 local_768 [4];
  undefined1 auStack_764 [12];
  undefined1 local_758 [40];
  undefined1 local_730 [8];
  size_type local_728;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_720;
  _Alloc_hider local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  _Alloc_hider local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6e0;
  qpKeyValueTag local_6d0;
  float local_6cc;
  LogNumber<long> local_6c8;
  undefined1 local_658 [16];
  float *local_648;
  iterator iStack_640;
  float *local_638;
  LogNumber<float> local_628;
  ulong local_5b8;
  long local_5b0;
  float *local_5a8;
  undefined1 local_5a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  _Alloc_hider local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  _Alloc_hider local_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  qpKeyValueTag local_540;
  float local_53c;
  undefined1 local_538 [8];
  undefined1 auStack_530 [24];
  string local_518;
  string local_4f8;
  qpSampleValueTag local_4d8;
  float local_4d4;
  deInt64 local_4d0;
  ios_base local_4c8 [8];
  ios_base local_4c0 [264];
  string local_3b8;
  string local_398;
  string local_378;
  long *local_358;
  long local_350;
  long local_348;
  long lStack_340;
  string local_338;
  string local_318;
  string local_2f8;
  long *local_2d8 [2];
  long local_2c8 [2];
  string local_2b8;
  string local_298;
  long *local_278 [2];
  long local_268 [2];
  undefined1 local_258 [8];
  undefined1 auStack_250 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  string local_238;
  string local_218;
  qpSampleValueTag local_1f8;
  float local_1f4;
  deInt64 local_1f0;
  ios_base local_1e0 [272];
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_calibrator;
  SVar11 = deqp::gls::TheilSenCalibrator::getState(this_00);
  if (SVar11 == STATE_FINISHED) {
    if (this->m_state - STATE_FIND_HIGH_WORKLOAD < 2) {
      if (this->m_workloadMeasurementNdx < this->m_numMeasurementsPerWorkload) {
        pvVar27 = &this->m_workloadRecords;
        if (this->m_state == STATE_FIND_HIGH_WORKLOAD) {
          pvVar27 = &this->m_workloadRecordsFindHigh;
        }
        pWVar47 = (pvVar27->
                  super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[this->m_measureProgramNdx].
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar13 = (this->m_calibrator).m_measureState.numDrawCalls;
        dVar15 = deGetMicroseconds();
        render(this,iVar13);
        dVar14 = deGetMicroseconds();
        local_538._0_4_ = (float)(dVar14 - dVar15);
        __position._M_current =
             pWVar47[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            pWVar47[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&pWVar47[-1].frameTimes,__position,
                     (float *)local_538);
        }
        else {
          *__position._M_current = (float)(dVar14 - dVar15);
          pWVar47[-1].frameTimes.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        this->m_workloadMeasurementNdx = this->m_workloadMeasurementNdx + 1;
      }
      else {
        prepareNextRound(this);
      }
      IVar35 = CONTINUE;
    }
    else {
      afVar2 = (float  [2])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      local_5b8 = (ulong)(this->m_calibrator).m_measureState.numDrawCalls;
      local_838 = this;
      if ((int)((ulong)((long)(this->m_programs).
                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_programs).
                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
        local_7d0 = (float *)0x0;
        local_860 = (float *)0x0;
      }
      else {
        lVar41 = 0;
        local_860 = (float *)0x0;
        pfVar31 = (float *)0x0;
        local_7d0 = (float *)0x0;
        do {
          pvVar3 = (local_838->m_workloadRecords).
                   super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_628.m_name._M_dataplus._M_p = (pointer)0x0;
          local_628.m_name._M_string_length = 0;
          local_628.m_name.field_2._M_allocated_capacity = 0;
          local_5b0 = lVar41;
          local_5a8 = pfVar31;
          if (0 < (int)((ulong)((long)pvVar3[lVar41].
                                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               *(long *)&pvVar3[lVar41].
                                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                         ._M_impl.super__Vector_impl_data) >> 5)) {
            pvVar3 = pvVar3 + lVar41;
            lVar46 = 0;
            lVar41 = 0;
            do {
              lVar4 = *(long *)&(pvVar3->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                )._M_impl.super__Vector_impl_data;
              iVar13 = *(int *)(lVar4 + lVar46);
              local_538._4_4_ = WorkloadRecord::getMedianTime((WorkloadRecord *)(lVar4 + lVar46));
              local_538._0_4_ = (float)iVar13;
              std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
              emplace_back<tcu::Vector<float,2>>
                        ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)
                         &local_628,(Vector<float,_2> *)local_538);
              lVar41 = lVar41 + 1;
              lVar46 = lVar46 + 0x20;
            } while (lVar41 < (int)((ulong)((long)(pvVar3->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                           *(long *)&(pvVar3->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                                  )._M_impl.super__Vector_impl_data) >> 5));
          }
          auStack_530._0_8_ = auStack_530._0_8_ & 0xffffffff00000000;
          auStack_530._8_8_ = (_Base_ptr)0x0;
          local_518._M_string_length = 0;
          auStack_530._16_8_ = auStack_530;
          local_518._M_dataplus._M_p = auStack_530;
          if (0 < (int)(local_628.m_name._M_string_length - (long)local_628.m_name._M_dataplus._M_p
                       >> 3)) {
            lVar41 = 0;
            do {
              local_258._0_4_ = *(undefined4 *)(local_628.m_name._M_dataplus._M_p + lVar41 * 8);
              std::
              _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
              ::_M_insert_unique<float>
                        ((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                          *)local_538,(float *)local_258);
              lVar41 = lVar41 + 1;
            } while (lVar41 < (int)(local_628.m_name._M_string_length -
                                    (long)local_628.m_name._M_dataplus._M_p >> 3));
          }
          fVar50 = -INFINITY;
          if ((undefined1 *)auStack_530._16_8_ != auStack_530) {
            fVar50 = -INFINITY;
            local_658._0_4_ = 0x7f800000;
            afVar17 = (float  [2])auStack_530._16_8_;
            do {
              local_258 = (undefined1  [8])0x0;
              auStack_250 = (undefined1  [8])0x0;
              local_248._M_allocated_capacity = 0;
              local_6c8.m_name.field_2._M_allocated_capacity = 0;
              local_6c8.m_name._M_dataplus._M_p = (pointer)0x0;
              local_6c8.m_name._M_string_length = 0;
              if (0 < (int)(local_628.m_name._M_string_length -
                            (long)local_628.m_name._M_dataplus._M_p >> 3)) {
                lVar41 = 0;
                lVar46 = 0;
                do {
                  fVar51 = (float)((_Rb_tree_node_base *)((long)afVar17 + 0x20))->_M_color;
                  pLVar39 = (LogNumber<long> *)local_258;
                  if (fVar51 < *(float *)(local_628.m_name._M_dataplus._M_p + lVar41) ||
                      fVar51 == *(float *)(local_628.m_name._M_dataplus._M_p + lVar41)) {
                    pLVar39 = &local_6c8;
                  }
                  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                  push_back((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)pLVar39,(value_type *)(local_628.m_name._M_dataplus._M_p + lVar41));
                  lVar46 = lVar46 + 1;
                  lVar41 = lVar41 + 8;
                } while (lVar46 < (int)(local_628.m_name._M_string_length -
                                        (long)local_628.m_name._M_dataplus._M_p >> 3));
              }
              iVar13 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                     *)&local_6c8);
              if (2 < iVar13) {
                iVar26 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       *)local_258);
                auVar9._12_4_ = 0;
                auVar9._0_12_ = auStack_764;
                _local_768 = auVar9 << 0x20;
                if (2 < iVar26) {
                  mean<2>((Performance *)local_730,
                          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          local_258);
                  uVar16 = (long)auStack_250 - (long)local_258 >> 3;
                  uVar12 = (uint)uVar16;
                  if ((int)uVar12 < 1) {
                    fVar51 = 0.0;
                  }
                  else {
                    fVar51 = 0.0;
                    uVar36 = 0;
                    do {
                      fVar51 = fVar51 + ((float)local_730._4_4_ -
                                        *(float *)((long)local_258 + uVar36 * 8 + 4)) *
                                        ((float)local_730._4_4_ -
                                        *(float *)((long)local_258 + uVar36 * 8 + 4));
                      uVar36 = uVar36 + 1;
                    } while ((uVar12 & 0x7fffffff) != uVar36);
                  }
                  local_768 = (undefined1  [4])(fVar51 / (float)uVar16);
                }
                iVar26 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                       *)&local_6c8);
                fVar51 = 0.0;
                if (2 < iVar26) {
                  mean<2>((Performance *)local_730,
                          (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                          &local_6c8);
                  fVar49 = NAN;
                  uVar12 = (uint)(local_6c8.m_name._M_string_length -
                                  (long)local_6c8.m_name._M_dataplus._M_p >> 3);
                  if (0 < (int)uVar12) {
                    fVar49 = 0.0;
                    uVar16 = 0;
                    fVar51 = 0.0;
                    _Var37._M_p = local_6c8.m_name._M_dataplus._M_p;
                    do {
                      local_5a0._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      lVar41 = 0;
                      do {
                        *(float *)(local_5a0 + lVar41 * 4) =
                             *(float *)((long)_Var37._M_p + lVar41 * 4) -
                             *(float *)(local_730 + lVar41 * 4);
                        lVar41 = lVar41 + 1;
                      } while (lVar41 == 1);
                      fVar49 = fVar49 + (float)local_5a0._4_4_ * (float)local_5a0._0_4_;
                      fVar51 = fVar51 + (float)local_5a0._0_4_ * (float)local_5a0._0_4_;
                      uVar16 = uVar16 + 1;
                      _Var37._M_p = _Var37._M_p + 8;
                    } while (uVar16 != (uVar12 & 0x7fffffff));
                    fVar49 = fVar49 / fVar51;
                  }
                  uVar16 = (long)(local_6c8.m_name._M_string_length -
                                 (long)local_6c8.m_name._M_dataplus._M_p) >> 3;
                  uVar12 = (uint)uVar16;
                  if ((int)uVar12 < 1) {
                    fVar51 = 0.0;
                  }
                  else {
                    fVar51 = 0.0;
                    uVar36 = 0;
                    do {
                      fVar52 = (*(float *)(local_6c8.m_name._M_dataplus._M_p + uVar36 * 8) * fVar49
                               + ((float)local_730._4_4_ - (float)local_730._0_4_ * fVar49)) -
                               *(float *)(local_6c8.m_name._M_dataplus._M_p + uVar36 * 8 + 4);
                      fVar51 = fVar51 + fVar52 * fVar52;
                      uVar36 = uVar36 + 1;
                    } while ((uVar12 & 0x7fffffff) != uVar36);
                  }
                  fVar51 = fVar51 / (float)uVar16;
                }
                if ((float)local_768 + fVar51 < (float)local_658._0_4_) {
                  fVar50 = (float)((_Rb_tree_node_base *)((long)afVar17 + 0x20))->_M_color;
                  local_658._0_4_ = (float)local_768 + fVar51;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6c8.m_name._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_6c8.m_name._M_dataplus._M_p,
                                local_6c8.m_name.field_2._M_allocated_capacity -
                                (long)local_6c8.m_name._M_dataplus._M_p);
              }
              if (local_258 != (undefined1  [8])0x0) {
                operator_delete((void *)local_258,local_248._M_allocated_capacity - (long)local_258)
                ;
              }
            } while ((2 < iVar13) &&
                    (afVar17 = (float  [2])std::_Rb_tree_increment((_Rb_tree_node_base *)afVar17),
                    afVar17 != (float  [2])auStack_530));
          }
          std::
          _Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>::
          ~_Rb_tree((_Rb_tree<float,_float,_std::_Identity<float>,_std::less<float>,_std::allocator<float>_>
                     *)local_538);
          pfVar34 = local_5a8;
          auStack_530._8_8_ = (qpTestLog *)0x0;
          local_538._0_4_ = 0.0;
          local_538._4_4_ = 0.0;
          auStack_530._0_4_ = 0.0;
          auStack_530._4_4_ = 0.0;
          local_248._M_allocated_capacity = 0;
          local_258 = (undefined1  [8])0x0;
          auStack_250 = (undefined1  [8])0x0;
          if (0 < (int)(local_628.m_name._M_string_length - (long)local_628.m_name._M_dataplus._M_p
                       >> 3)) {
            lVar41 = 0;
            lVar46 = 0;
            do {
              pLVar39 = (LogNumber<long> *)local_538;
              if (fVar50 < *(float *)(local_628.m_name._M_dataplus._M_p + lVar41) ||
                  fVar50 == *(float *)(local_628.m_name._M_dataplus._M_p + lVar41)) {
                pLVar39 = (LogNumber<long> *)local_258;
              }
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::push_back
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         pLVar39,(value_type *)(local_628.m_name._M_dataplus._M_p + lVar41));
              lVar46 = lVar46 + 1;
              lVar41 = lVar41 + 8;
            } while (lVar46 < (int)(local_628.m_name._M_string_length -
                                    (long)local_628.m_name._M_dataplus._M_p >> 3));
          }
          LVar6 = deqp::gls::theilSenLinearRegression
                            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)local_538);
          auStack_764._4_4_ = extraout_XMM0_Dc;
          local_768 = (undefined1  [4])LVar6.offset;
          auStack_764._0_4_ = LVar6.coefficient;
          auStack_764._8_4_ = extraout_XMM0_Dd;
          LVar6 = deqp::gls::theilSenLinearRegression
                            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              *)local_258);
          local_658._8_4_ = extraout_XMM0_Dc_00;
          local_658._0_4_ = LVar6.offset;
          local_658._4_4_ = LVar6.coefficient;
          local_658._12_4_ = extraout_XMM0_Dd_00;
          iVar13 = numDistinctX((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 *)local_538);
          if (iVar13 < 2) {
LAB_0138fbc3:
            LVar6 = deqp::gls::theilSenLinearRegression
                              ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                *)&local_628);
            local_658._8_4_ = extraout_XMM0_Dc_01;
            local_658._0_4_ = LVar6.offset;
            local_658._4_4_ = LVar6.coefficient;
            local_658._12_4_ = extraout_XMM0_Dd_01;
            _local_768 = (double)((ulong)LVar6 & 0xffffffff);
            auStack_764._4_4_ = LVar6.coefficient;
            auStack_764._8_4_ = 0;
            fVar50 = -INFINITY;
          }
          else if ((float)local_658._4_4_ * 0.5 < (float)auStack_764._0_4_) goto LAB_0138fbc3;
          if (local_258 != (undefined1  [8])0x0) {
            operator_delete((void *)local_258,local_248._M_allocated_capacity - (long)local_258);
          }
          if ((float  [2])local_538 != (float  [2])0x0) {
            operator_delete((void *)local_538,auStack_530._8_8_ - (long)local_538);
          }
          if (pfVar34 == local_7d0) {
            if ((long)pfVar34 - (long)local_860 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            lVar41 = (long)pfVar34 - (long)local_860 >> 2;
            uVar36 = lVar41 * -0x3333333333333333;
            uVar16 = uVar36;
            if (pfVar34 == local_860) {
              uVar16 = 1;
            }
            uVar42 = uVar16 + uVar36;
            if (0x666666666666665 < uVar42) {
              uVar42 = 0x666666666666666;
            }
            if (CARRY8(uVar16,uVar36)) {
              uVar42 = 0x666666666666666;
            }
            if (uVar42 == 0) {
              pfVar18 = (float *)0x0;
            }
            else {
              pfVar18 = (float *)operator_new(uVar42 * 0x14);
            }
            pfVar18[lVar41] = fVar50;
            pfVar31 = pfVar18 + lVar41 + 1;
            *pfVar31 = (float)local_768;
            pfVar31[1] = (float)auStack_764._0_4_;
            pfVar31[2] = local_658._0_4_;
            pfVar31[3] = local_658._4_4_;
            pfVar31 = pfVar18;
            for (pfVar19 = local_860; pfVar34 != pfVar19; pfVar19 = pfVar19 + 5) {
              pfVar31[4] = pfVar19[4];
              uVar8 = *(undefined8 *)(pfVar19 + 2);
              *(undefined8 *)pfVar31 = *(undefined8 *)pfVar19;
              *(undefined8 *)(pfVar31 + 2) = uVar8;
              pfVar31 = pfVar31 + 5;
            }
            if (local_860 != (float *)0x0) {
              operator_delete(local_860,(long)local_7d0 - (long)local_860);
            }
            local_7d0 = pfVar18 + uVar42 * 5;
            local_860 = pfVar18;
          }
          else {
            *pfVar34 = fVar50;
            pfVar34[1] = (float)local_768;
            pfVar34[2] = (float)auStack_764._0_4_;
            pfVar34[3] = local_658._0_4_;
            pfVar34[4] = local_658._4_4_;
            pfVar31 = pfVar34;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628.m_name._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_628.m_name._M_dataplus._M_p,
                            local_628.m_name.field_2._M_allocated_capacity -
                            (long)local_628.m_name._M_dataplus._M_p);
          }
          pfVar31 = pfVar31 + 5;
          lVar41 = local_5b0 + 1;
        } while (lVar41 < (int)((ulong)((long)(local_838->m_programs).
                                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(local_838->m_programs).
                                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
      }
      uVar12 = (uint)((ulong)((long)(local_838->m_programs).
                                    super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_838->m_programs).
                                   super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      if (0 < (int)uVar12) {
        local_868 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_538);
          std::ostream::operator<<((ostringstream *)local_538,(int)local_868);
          std::__cxx11::stringbuf::str();
          __n = &std::__cxx11::ostringstream::VTT;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_538);
          std::ios_base::~ios_base(local_4c8);
          pvVar3 = (local_838->m_workloadRecords).
                   super__Vector_base<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar41 = (long)pvVar3[local_868].
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   *(long *)&pvVar3[local_868].
                             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                             ._M_impl.super__Vector_impl_data;
          local_758._0_8_ = (pointer)0x0;
          local_758._8_8_ = (pointer)0x0;
          local_758._16_8_ = (pointer)0x0;
          pWVar20 = std::
                    _Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                    ::_M_allocate((_Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                   *)(lVar41 >> 5),(size_t)__n);
          local_758._16_8_ = lVar41 + (long)pWVar20;
          pWVar5 = pvVar3[local_868].
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pWVar10 = pWVar20;
          local_758._8_8_ = pWVar20;
          for (pWVar47 = pvVar3[local_868].
                         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                         ._M_impl.super__Vector_impl_data._M_start; local_758._0_8_ = pWVar10,
              pWVar47 != pWVar5; pWVar47 = pWVar47 + 1) {
            pWVar20->workloadSize = pWVar47->workloadSize;
            std::vector<float,_std::allocator<float>_>::vector
                      (&pWVar20->frameTimes,&pWVar47->frameTimes);
            pWVar20 = pWVar20 + 1;
            pWVar10 = (pointer)local_758._0_8_;
          }
          local_758._8_8_ = pWVar20;
          if (pWVar10 != pWVar20) {
            uVar16 = (long)pWVar20 - (long)pWVar10 >> 5;
            lVar41 = 0x3f;
            if (uVar16 != 0) {
              for (; uVar16 >> lVar41 == 0; lVar41 = lVar41 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (pWVar10,pWVar20,((uint)lVar41 ^ 0x3f) * 2 ^ 0x7e);
            if ((long)pWVar20 - (long)pWVar10 < 0x201) {
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pWVar10,pWVar20);
            }
            else {
              pWVar47 = pWVar10 + 0x10;
              std::
              __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (pWVar10,pWVar47);
              for (; pWVar47 != pWVar20; pWVar47 = pWVar47 + 1) {
                std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord*,std::vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>>>,__gnu_cxx::__ops::_Val_less_iter>
                          (pWVar47);
              }
            }
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,"Program",&local_628.m_name);
          pafVar21 = (float (*) [2])std::__cxx11::string::append((char *)local_258);
          afVar17 = (float  [2])((long)auStack_530 + 8);
          afVar28 = (float  [2])(pafVar21 + 2);
          if (*pafVar21 == afVar28) {
            auStack_530._8_8_ = *(undefined8 *)afVar28;
            auStack_530._16_8_ = pafVar21[3];
            local_538 = (undefined1  [8])afVar17;
          }
          else {
            auStack_530._8_8_ = *(undefined8 *)afVar28;
            local_538 = (undefined1  [8])*pafVar21;
          }
          auStack_530._0_8_ = pafVar21[1];
          *pafVar21 = afVar28;
          pafVar21[1] = (float  [2])0x0;
          *(undefined1 *)pafVar21[2] = 0;
          std::operator+(&local_6c8.m_name,"Measurements for program ",&local_628.m_name);
          tcu::ScopedLogSection::ScopedLogSection
                    ((ScopedLogSection *)&local_3b8,(TestLog *)afVar2,(string *)local_538,
                     &local_6c8.m_name);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
            operator_delete(local_6c8.m_name._M_dataplus._M_p,
                            local_6c8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((float  [2])local_538 != afVar17) {
            operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
          }
          if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
            operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a0,"Program",&local_628.m_name);
          plVar22 = (long *)std::__cxx11::string::append((char *)local_5a0);
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 == paVar29) {
            local_720._M_allocated_capacity = paVar29->_M_allocated_capacity;
            local_720._8_4_ = (undefined4)plVar22[3];
            local_720._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
            local_730 = (undefined1  [8])&local_720;
          }
          else {
            local_720._M_allocated_capacity = paVar29->_M_allocated_capacity;
            local_730 = (undefined1  [8])*plVar22;
          }
          local_728 = plVar22[1];
          *plVar22 = (long)paVar29;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_830,"Individual frame times","");
          tcu::LogSampleList::LogSampleList
                    ((LogSampleList *)&local_6c8,(string *)local_730,&local_830);
          tcu::TestLog::startSampleList((TestLog *)afVar2,&local_6c8.m_name,&local_6c8.m_desc);
          tcu::TestLog::startSampleInfo((TestLog *)afVar2);
          local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"Workload","");
          local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"Workload","");
          local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,0x1b32ab9);
          tcu::LogValueInfo::LogValueInfo
                    ((LogValueInfo *)local_538,&local_858,&local_810,&local_788,
                     QP_SAMPLE_VALUE_TAG_PREDICTOR);
          tcu::TestLog::writeValueInfo
                    ((TestLog *)afVar2,(string *)local_538,&local_518,&local_4f8,local_4d8);
          local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"FrameTime","");
          local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"Frame time","");
          local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"us","");
          tcu::LogValueInfo::LogValueInfo
                    ((LogValueInfo *)local_258,&local_7f0,&local_7c8,&local_7a8,
                     QP_SAMPLE_VALUE_TAG_RESPONSE);
          tcu::TestLog::writeValueInfo
                    ((TestLog *)afVar2,(string *)local_258,&local_238,&local_218,local_1f8);
          tcu::TestLog::endSampleInfo((TestLog *)afVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
            operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
            operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if ((float  [2])local_538 != afVar17) {
            operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_788._M_dataplus._M_p != &local_788.field_2) {
            operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_810._M_dataplus._M_p != &local_810.field_2) {
            operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_858._M_dataplus._M_p != &local_858.field_2) {
            operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_desc._M_dataplus._M_p != &local_6c8.m_desc.field_2) {
            operator_delete(local_6c8.m_desc._M_dataplus._M_p,
                            local_6c8.m_desc.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
            operator_delete(local_6c8.m_name._M_dataplus._M_p,
                            local_6c8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_830._M_dataplus._M_p != &local_830.field_2) {
            operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
          }
          if (local_730 != (undefined1  [8])&local_720) {
            operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._0_8_ != &local_590) {
            operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
          }
          uVar8 = local_758._0_8_;
          uVar12 = (uint)((ulong)(local_758._8_8_ - local_758._0_8_) >> 5);
          if (0 < (int)uVar12) {
            uVar16 = 0;
            do {
              lVar41 = uVar16 * 0x20;
              if (0 < (int)((ulong)(*(long *)(uVar8 + lVar41 + 0x10) - *(long *)(uVar8 + lVar41 + 8)
                                   ) >> 2)) {
                piVar43 = (int *)(uVar8 + lVar41);
                lVar41 = 0;
                do {
                  auStack_530._0_4_ = 0.0;
                  auStack_530._4_4_ = 0.0;
                  auStack_530._8_8_ = (qpTestLog *)0x0;
                  auStack_530._16_4_ = 0.0;
                  auStack_530._20_4_ = 0.0;
                  local_538 = (undefined1  [8])afVar2;
                  pSVar23 = tcu::SampleBuilder::operator<<((SampleBuilder *)local_538,*piVar43);
                  pSVar23 = tcu::SampleBuilder::operator<<
                                      (pSVar23,*(float *)(*(long *)(piVar43 + 2) + lVar41 * 4));
                  tcu::SampleBuilder::operator<<(pSVar23,(EndSampleToken *)&tcu::TestLog::EndSample)
                  ;
                  if ((float  [2])auStack_530._0_8_ != (float  [2])0x0) {
                    operator_delete((void *)auStack_530._0_8_,auStack_530._16_8_ - auStack_530._0_8_
                                   );
                  }
                  lVar41 = lVar41 + 1;
                } while (lVar41 < (int)((ulong)(*(long *)(piVar43 + 4) - *(long *)(piVar43 + 2)) >>
                                       2));
              }
              uVar16 = uVar16 + 1;
            } while (uVar16 != (uVar12 & 0x7fffffff));
          }
          tcu::TestLog::endSampleList((TestLog *)afVar2);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a0,"Program",&local_628.m_name);
          plVar22 = (long *)std::__cxx11::string::append((char *)local_5a0);
          paVar29 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar22 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar22 == paVar29) {
            local_720._M_allocated_capacity = paVar29->_M_allocated_capacity;
            local_720._8_4_ = (undefined4)plVar22[3];
            local_720._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
            local_730 = (undefined1  [8])&local_720;
          }
          else {
            local_720._M_allocated_capacity = paVar29->_M_allocated_capacity;
            local_730 = (undefined1  [8])*plVar22;
          }
          local_728 = plVar22[1];
          *plVar22 = (long)paVar29;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_830,"Median frame times","");
          tcu::LogSampleList::LogSampleList
                    ((LogSampleList *)&local_6c8,(string *)local_730,&local_830);
          tcu::TestLog::startSampleList((TestLog *)afVar2,&local_6c8.m_name,&local_6c8.m_desc);
          tcu::TestLog::startSampleInfo((TestLog *)afVar2);
          local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,"Workload","");
          local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"Workload","");
          local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,0x1b32ab9);
          tcu::LogValueInfo::LogValueInfo
                    ((LogValueInfo *)local_538,&local_858,&local_810,&local_788,
                     QP_SAMPLE_VALUE_TAG_PREDICTOR);
          tcu::TestLog::writeValueInfo
                    ((TestLog *)afVar2,(string *)local_538,&local_518,&local_4f8,local_4d8);
          local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"MedianFrameTime","")
          ;
          local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_7c8,"Median frame time","");
          local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"us","");
          tcu::LogValueInfo::LogValueInfo
                    ((LogValueInfo *)local_258,&local_7f0,&local_7c8,&local_7a8,
                     QP_SAMPLE_VALUE_TAG_RESPONSE);
          tcu::TestLog::writeValueInfo
                    ((TestLog *)afVar2,(string *)local_258,&local_238,&local_218,local_1f8);
          tcu::TestLog::endSampleInfo((TestLog *)afVar2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
            operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
            operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
            operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if (local_538 != (undefined1  [8])((long)auStack_530 + 8)) {
            operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_788._M_dataplus._M_p != &local_788.field_2) {
            operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_810._M_dataplus._M_p != &local_810.field_2) {
            operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_858._M_dataplus._M_p != &local_858.field_2) {
            operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_desc._M_dataplus._M_p != &local_6c8.m_desc.field_2) {
            operator_delete(local_6c8.m_desc._M_dataplus._M_p,
                            local_6c8.m_desc.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
            operator_delete(local_6c8.m_name._M_dataplus._M_p,
                            local_6c8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_830._M_dataplus._M_p != &local_830.field_2) {
            operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
          }
          if (local_730 != (undefined1  [8])&local_720) {
            operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._0_8_ != &local_590) {
            operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
          }
          uVar12 = (uint)((ulong)(local_758._8_8_ - local_758._0_8_) >> 5);
          if (0 < (int)uVar12) {
            uVar16 = (ulong)(uVar12 & 0x7fffffff);
            this_04 = (WorkloadRecord *)local_758._0_8_;
            do {
              auStack_530._0_4_ = 0.0;
              auStack_530._4_4_ = 0.0;
              auStack_530._8_8_ = (qpTestLog *)0x0;
              auStack_530._16_4_ = 0.0;
              auStack_530._20_4_ = 0.0;
              local_538 = (undefined1  [8])afVar2;
              pSVar23 = tcu::SampleBuilder::operator<<
                                  ((SampleBuilder *)local_538,this_04->workloadSize);
              fVar50 = WorkloadRecord::getMedianTime(this_04);
              pSVar23 = tcu::SampleBuilder::operator<<(pSVar23,fVar50);
              tcu::SampleBuilder::operator<<(pSVar23,(EndSampleToken *)&tcu::TestLog::EndSample);
              if ((float  [2])auStack_530._0_8_ != (float  [2])0x0) {
                operator_delete((void *)auStack_530._0_8_,auStack_530._16_8_ - auStack_530._0_8_);
              }
              this_04 = this_04 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          tcu::TestLog::endSampleList((TestLog *)afVar2);
          std::operator+(&local_6c8.m_name,"Program",&local_628.m_name);
          puVar24 = (undefined8 *)std::__cxx11::string::append((char *)&local_6c8);
          local_258 = (undefined1  [8])(auStack_250 + 8);
          pTVar30 = (TestLog *)(puVar24 + 2);
          if ((TestLog *)*puVar24 == pTVar30) {
            local_248._M_allocated_capacity = (size_type)pTVar30->m_log;
            local_248._8_4_ = *(undefined4 *)(puVar24 + 3);
            local_248._12_4_ = *(undefined4 *)((long)(puVar24 + 3) + 4);
          }
          else {
            local_248._M_allocated_capacity = (size_type)pTVar30->m_log;
            local_258 = (undefined1  [8])*puVar24;
          }
          auStack_250 = (undefined1  [8])puVar24[1];
          *puVar24 = pTVar30;
          puVar24[1] = 0;
          *(undefined1 *)(puVar24 + 2) = 0;
          local_730 = (undefined1  [8])&local_720;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_730,"Workload cost estimate","");
          local_5a0._0_8_ = &local_590;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"us / workload","");
          pfVar31 = local_860 + local_868 * 5;
          tcu::LogNumber<float>::LogNumber
                    ((LogNumber<float> *)local_538,(string *)local_258,(string *)local_730,
                     (string *)local_5a0,QP_KEY_TAG_TIME,pfVar31[4]);
          tcu::TestLog::writeFloat
                    ((TestLog *)afVar2,(char *)local_538,local_518._M_dataplus._M_p,
                     local_4f8._M_dataplus._M_p,local_4d8,local_4d4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
            operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_dataplus._M_p != &local_518.field_2) {
            operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          }
          if (local_538 != (undefined1  [8])((long)auStack_530 + 8)) {
            operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a0._0_8_ != &local_590) {
            operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
          }
          if (local_730 != (undefined1  [8])&local_720) {
            operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
          }
          if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
            operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
            operator_delete(local_6c8.m_name._M_dataplus._M_p,
                            local_6c8.m_name.field_2._M_allocated_capacity + 1);
          }
          if (*pfVar31 == -INFINITY) {
            local_538 = (undefined1  [8])afVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,"Note: the data seem to form a single line: ",0x2b);
            lineParamsString_abi_cxx11_((string *)local_258,(Performance *)(pfVar31 + 3),params_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,(char *)local_258,(long)auStack_250);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
              operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
            this_03 = local_4c0;
          }
          else {
            local_258 = (undefined1  [8])afVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_250,
                       "Note: the data points with x coordinate greater than or equal to ",0x41);
            std::ostream::_M_insert<double>((double)*pfVar31);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_250,
                       " seem to form a rising line, and the rest of data points seem to form a near-horizontal line"
                       ,0x5c);
            local_538 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_258,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,"Note: the left line is estimated to be ",0x27);
            lineParamsString_abi_cxx11_(&local_6c8.m_name,(Performance *)(pfVar31 + 1),params);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,local_6c8.m_name._M_dataplus._M_p,
                       local_6c8.m_name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530," and the right line ",0x14);
            lineParamsString_abi_cxx11_((string *)local_730,(Performance *)(pfVar31 + 3),params_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,(char *)local_730,local_728);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_730 != (undefined1  [8])&local_720) {
              operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
              operator_delete(local_6c8.m_name._M_dataplus._M_p,
                              local_6c8.m_name.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
            std::ios_base::~ios_base(local_4c0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_250);
            this_03 = local_1e0;
          }
          std::ios_base::~ios_base(this_03);
          tcu::TestLog::endSection((TestLog *)local_3b8._M_dataplus._M_p);
          std::
          vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
          ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                     *)local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628.m_name._M_dataplus._M_p != &local_628.m_name.field_2) {
            operator_delete(local_628.m_name._M_dataplus._M_p,
                            local_628.m_name.field_2._M_allocated_capacity + 1);
          }
          local_868 = local_868 + 1;
          uVar12 = (uint)((ulong)((long)(local_838->m_programs).
                                        super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_838->m_programs).
                                       super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4);
        } while (local_868 < (int)uVar12);
      }
      uVar16 = local_5b8;
      pOVar45 = local_838;
      if (0 < (int)uVar12) {
        pfVar31 = local_860 + 4;
        uVar36 = 0;
        do {
          if (*pfVar31 <= 0.0) {
            local_538 = (undefined1  [8])afVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,"Slope of measurements for program ",0x22);
            std::ostream::operator<<((ostringstream *)auStack_530,(int)uVar36);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530," isn\'t positive. Can\'t get sensible result.",0x2b);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
            std::ios_base::~ios_base(local_4c0);
            pIVar25 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (pIVar25,"Unable to get sensible measurements for estimation",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                       ,0x3ea);
            __cxa_throw(pIVar25,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
          uVar36 = uVar36 + 1;
          pfVar31 = pfVar31 + 5;
        } while (uVar12 != uVar36);
      }
      local_648 = (float *)0x0;
      iStack_640._M_current = (float *)0x0;
      local_638 = (float *)0x0;
      if (0 < (int)((ulong)((long)(local_838->m_programs).
                                  super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_838->m_programs).
                                 super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        pfVar31 = local_860 + 4;
        lVar41 = 0;
        do {
          if (iStack_640._M_current == local_638) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)&local_648,iStack_640,pfVar31);
          }
          else {
            *iStack_640._M_current = *pfVar31;
            iStack_640._M_current = iStack_640._M_current + 1;
          }
          lVar41 = lVar41 + 1;
          pfVar31 = pfVar31 + 5;
        } while (lVar41 < (int)((ulong)((long)(pOVar45->m_programs).
                                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(pOVar45->m_programs).
                                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
      }
      (*(pOVar45->super_TestCase).super_TestNode._vptr_TestNode[9])(pOVar45);
      pfVar31 = local_648 + 1;
      pfVar34 = local_648;
      if (pfVar31 != iStack_640._M_current && local_648 != iStack_640._M_current) {
        do {
          pfVar18 = pfVar31;
          if (*pfVar31 < *pfVar34 || *pfVar31 == *pfVar34) {
            pfVar18 = pfVar34;
          }
          pfVar34 = pfVar18;
          pfVar31 = pfVar31 + 1;
        } while (pfVar31 != iStack_640._M_current);
      }
      local_658._0_4_ = *pfVar34;
      (*(pOVar45->super_TestCase).super_TestNode._vptr_TestNode[8])(pOVar45,&local_648);
      if (pOVar45->m_caseType == CASETYPE_VERTEX) {
        iVar13 = pOVar45->m_gridSizeX * pOVar45->m_gridSizeY * 6;
      }
      else {
        iVar13 = pOVar45->m_viewportHeight * pOVar45->m_viewportWidth;
      }
      fVar50 = floorf((local_860[1] - local_860[3]) / (value - local_860[2]));
      iVar26 = 0;
      if (0 < (int)fVar50) {
        iVar26 = (int)fVar50;
      }
      local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_830,"VertexOrFragmentCount","");
      bVar48 = pOVar45->m_caseType != CASETYPE_VERTEX;
      pcVar38 = "Fragment";
      if (!bVar48) {
        pcVar38 = "Vertex";
      }
      local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_788,pcVar38,pcVar38 + (ulong)bVar48 * 2 + 6);
      plVar22 = (long *)std::__cxx11::string::replace((ulong)&local_788,0,(char *)0x0,0x1c47c7b);
      local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
      psVar32 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar32) {
        local_810.field_2._M_allocated_capacity = *psVar32;
        local_810.field_2._8_8_ = plVar22[3];
      }
      else {
        local_810.field_2._M_allocated_capacity = *psVar32;
        local_810._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_810._M_string_length = plVar22[1];
      *plVar22 = (long)psVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_810);
      local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
      psVar32 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar32) {
        local_858.field_2._M_allocated_capacity = *psVar32;
        local_858.field_2._8_4_ = (undefined4)plVar22[3];
        local_858.field_2._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
      }
      else {
        local_858.field_2._M_allocated_capacity = *psVar32;
        local_858._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_858._M_string_length = plVar22[1];
      *plVar22 = (long)psVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,0x1b32ab9);
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_538,&local_830,&local_858,&local_7f0,QP_KEY_TAG_NONE,
                 (long)iVar13);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar2,(char *)local_538,local_518._M_dataplus._M_p,
                 local_4f8._M_dataplus._M_p,local_4d8,local_4d0);
      local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"DrawCallsPerFrame","");
      local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_7a8,"D = Draw calls per frame","");
      local_758._0_8_ = local_758 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_758,0x1b32ab9);
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_258,&local_7c8,&local_7a8,(string *)local_758,
                 QP_KEY_TAG_NONE,uVar16);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar2,(char *)local_258,local_238._M_dataplus._M_p,
                 local_218._M_dataplus._M_p,local_1f8,local_1f0);
      local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_3b8,"VerticesOrFragmentsPerFrame","");
      bVar48 = pOVar45->m_caseType == CASETYPE_VERTEX;
      pcVar38 = "Fragments";
      if (bVar48) {
        pcVar38 = "Vertices";
      }
      local_278[0] = local_268;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_278,pcVar38,pcVar38 + ((ulong)bVar48 ^ 9));
      plVar22 = (long *)std::__cxx11::string::replace((ulong)local_278,0,(char *)0x0,0x1c1c54a);
      local_358 = &local_348;
      plVar33 = plVar22 + 2;
      if ((long *)*plVar22 == plVar33) {
        local_348 = *plVar33;
        lStack_340 = plVar22[3];
      }
      else {
        local_348 = *plVar33;
        local_358 = (long *)*plVar22;
      }
      local_350 = plVar22[1];
      *plVar22 = (long)plVar33;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_358);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      psVar32 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar32) {
        local_378.field_2._M_allocated_capacity = *psVar32;
        local_378.field_2._8_4_ = (undefined4)plVar22[3];
        local_378.field_2._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
      }
      else {
        local_378.field_2._M_allocated_capacity = *psVar32;
        local_378._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_378._M_string_length = plVar22[1];
      *plVar22 = (long)psVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,0x1b32ab9);
      iVar40 = (int)uVar16;
      iVar44 = iVar13 * iVar40;
      tcu::LogNumber<long>::LogNumber
                (&local_6c8,&local_3b8,&local_378,&local_298,QP_KEY_TAG_NONE,(long)iVar44);
      tcu::TestLog::writeInteger
                ((TestLog *)afVar2,local_6c8.m_name._M_dataplus._M_p,
                 local_6c8.m_desc._M_dataplus._M_p,local_6c8.m_unit._M_dataplus._M_p,local_6c8.m_tag
                 ,local_6c8.m_value);
      local_5b0 = CONCAT44(local_5b0._4_4_,iVar44);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"TimePerFramePerOp","");
      bVar48 = pOVar45->m_caseType == CASETYPE_VERTEX;
      pcVar38 = "fragments";
      if (bVar48) {
        pcVar38 = "vertices";
      }
      local_2d8[0] = local_2c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2d8,pcVar38,pcVar38 + ((ulong)bVar48 ^ 9));
      plVar22 = (long *)std::__cxx11::string::replace((ulong)local_2d8,0,(char *)0x0,0x1c1c56d);
      plVar33 = plVar22 + 2;
      if ((long *)*plVar22 == plVar33) {
        local_c0 = *plVar33;
        lStack_b8 = plVar22[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar33;
        local_d0 = (long *)*plVar22;
      }
      local_c8 = plVar22[1];
      *plVar22 = (long)plVar33;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      plVar22 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      psVar32 = (size_type *)(plVar22 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar32) {
        local_398.field_2._M_allocated_capacity = *psVar32;
        local_398.field_2._8_4_ = (undefined4)plVar22[3];
        local_398.field_2._12_4_ = *(undefined4 *)((long)plVar22 + 0x1c);
      }
      else {
        local_398.field_2._M_allocated_capacity = *psVar32;
        local_398._M_dataplus._M_p = (pointer)*plVar22;
      }
      local_398._M_string_length = plVar22[1];
      *plVar22 = (long)psVar32;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"us","");
      tcu::LogNumber<float>::LogNumber
                (&local_628,&local_2b8,&local_398,&local_2f8,QP_KEY_TAG_TIME,value);
      tcu::TestLog::writeFloat
                ((TestLog *)afVar2,local_628.m_name._M_dataplus._M_p,
                 local_628.m_desc._M_dataplus._M_p,local_628.m_unit._M_dataplus._M_p,local_628.m_tag
                 ,local_628.m_value);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_318,"TimePerDrawcallPerOp","");
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"Estimated cost of one draw call with one shader operation",""
                );
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"us","");
      _local_768 = (double)value;
      local_5a8 = (float *)((double)value / (double)iVar40);
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_730,&local_318,&local_338,&local_50,QP_KEY_TAG_TIME,
                 (float)(double)local_5a8);
      tcu::TestLog::writeFloat
                ((TestLog *)afVar2,(char *)local_730,local_710._M_p,local_6f0._M_p,local_6d0,
                 local_6cc);
      local_5b8 = CONCAT44(local_5b8._4_4_,iVar26);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TimePerSingleOp","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,"Estimated cost of a single shader operation","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"us","");
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_5a0,&local_70,&local_90,&local_b0,QP_KEY_TAG_TIME,
                 (float)((double)local_5a8 / (double)iVar13));
      tcu::TestLog::writeFloat
                ((TestLog *)afVar2,(char *)local_5a0._0_8_,local_580._M_p,local_560._M_p,local_540,
                 local_53c);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_p != &local_550) {
        operator_delete(local_560._M_p,local_550._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_580._M_p != &local_570) {
        operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._0_8_ != &local_590) {
        operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_p != &local_6e0) {
        operator_delete(local_6f0._M_p,local_6e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_p != &local_700) {
        operator_delete(local_710._M_p,local_700._M_allocated_capacity + 1);
      }
      if (local_730 != (undefined1  [8])&local_720) {
        operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.m_unit._M_dataplus._M_p != &local_628.m_unit.field_2) {
        operator_delete(local_628.m_unit._M_dataplus._M_p,
                        local_628.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.m_desc._M_dataplus._M_p != &local_628.m_desc.field_2) {
        operator_delete(local_628.m_desc._M_dataplus._M_p,
                        local_628.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628.m_name._M_dataplus._M_p != &local_628.m_name.field_2) {
        operator_delete(local_628.m_name._M_dataplus._M_p,
                        local_628.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_2d8[0] != local_2c8) {
        operator_delete(local_2d8[0],local_2c8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8.m_unit._M_dataplus._M_p != &local_6c8.m_unit.field_2) {
        operator_delete(local_6c8.m_unit._M_dataplus._M_p,
                        local_6c8.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8.m_desc._M_dataplus._M_p != &local_6c8.m_desc.field_2) {
        operator_delete(local_6c8.m_desc._M_dataplus._M_p,
                        local_6c8.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
        operator_delete(local_6c8.m_name._M_dataplus._M_p,
                        local_6c8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if (local_358 != &local_348) {
        operator_delete(local_358,local_348 + 1);
      }
      if (local_278[0] != local_268) {
        operator_delete(local_278[0],local_268[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
        operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((pointer)local_758._0_8_ != (pointer)(local_758 + 0x10)) {
        operator_delete((void *)local_758._0_8_,(ulong)(local_758._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
        operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
        operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
        operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_dataplus._M_p != &local_518.field_2) {
        operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
      }
      if (local_538 != (undefined1  [8])((long)auStack_530 + 8)) {
        operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
        operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_858._M_dataplus._M_p != &local_858.field_2) {
        operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_810._M_dataplus._M_p != &local_810.field_2) {
        operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788._M_dataplus._M_p != &local_788.field_2) {
        operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_830._M_dataplus._M_p != &local_830.field_2) {
        operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
      }
      if (value <= (float)local_658._0_4_ * -0.1) {
        local_538 = (undefined1  [8])afVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_530,"Got strongly negative result.",0x1d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
        std::ios_base::~ios_base(local_4c0);
        pIVar25 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar25,"Unable to get sensible measurements for estimation",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                   ,0x428);
        __cxa_throw(pIVar25,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
      if (_local_768 <= (double)(float)local_658._0_4_ * 0.001) {
        local_538 = (undefined1  [8])afVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_530,"Cost of operation seems to be approximately zero.",0x31);
        pOVar45 = local_838;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
        std::ios_base::~ios_base(local_4c0);
        tcu::TestContext::setTestResult
                  ((pOVar45->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        local_6c8.m_name._M_dataplus._M_p = (pointer)&local_6c8.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"OpsPerSecond","");
        local_628.m_name._M_dataplus._M_p = (pointer)&local_628.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_628,"Operations per second","");
        local_730 = (undefined1  [8])&local_720;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_730,"Million/s","");
        dVar7 = (double)(int)local_5b0 / _local_768;
        tcu::LogNumber<float>::LogNumber
                  ((LogNumber<float> *)local_258,&local_6c8.m_name,&local_628.m_name,
                   (string *)local_730,QP_KEY_TAG_PERFORMANCE,(float)dVar7);
        tcu::TestLog::writeFloat
                  ((TestLog *)afVar2,(char *)local_258,local_238._M_dataplus._M_p,
                   local_218._M_dataplus._M_p,local_1f8,local_1f4);
        local_5a0._0_8_ = &local_590;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5a0,"NumFreeOps","");
        local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_830,"Estimated number of \"free\" operations","");
        local_858._M_dataplus._M_p = (pointer)&local_858.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_858,0x1b32ab9);
        tcu::LogNumber<long>::LogNumber
                  ((LogNumber<long> *)local_538,(string *)local_5a0,&local_830,&local_858,
                   QP_KEY_TAG_PERFORMANCE,local_5b8 & 0xffffffff);
        tcu::TestLog::writeInteger
                  ((TestLog *)afVar2,(char *)local_538,local_518._M_dataplus._M_p,
                   local_4f8._M_dataplus._M_p,local_4d8,local_4d0);
        iVar13 = extraout_EDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
          operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_01;
        }
        if (local_538 != (undefined1  [8])((long)auStack_530 + 8)) {
          operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
          iVar13 = extraout_EDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_858._M_dataplus._M_p != &local_858.field_2) {
          operator_delete(local_858._M_dataplus._M_p,local_858.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_830._M_dataplus._M_p != &local_830.field_2) {
          operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a0._0_8_ != &local_590) {
          operator_delete((void *)local_5a0._0_8_,local_590._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_05;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_06;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_07;
        }
        if (local_258 != (undefined1  [8])(auStack_250 + 8)) {
          operator_delete((void *)local_258,(ulong)(local_248._M_allocated_capacity + 1));
          iVar13 = extraout_EDX_08;
        }
        pOVar45 = local_838;
        if (local_730 != (undefined1  [8])&local_720) {
          operator_delete((void *)local_730,local_720._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_09;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628.m_name._M_dataplus._M_p != &local_628.m_name.field_2) {
          operator_delete(local_628.m_name._M_dataplus._M_p,
                          local_628.m_name.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_10;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c8.m_name._M_dataplus._M_p != &local_6c8.m_name.field_2) {
          operator_delete(local_6c8.m_name._M_dataplus._M_p,
                          local_6c8.m_name.field_2._M_allocated_capacity + 1);
          iVar13 = extraout_EDX_11;
        }
        this_01 = (pOVar45->super_TestCase).super_TestNode.m_testCtx;
        de::floatToString_abi_cxx11_((string *)local_538,(de *)0x2,(float)dVar7,iVar13);
        tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,(char *)local_538);
        if (local_538 != (undefined1  [8])((long)auStack_530 + 8)) {
          operator_delete((void *)local_538,(ulong)(auStack_530._8_8_ + 1));
        }
      }
      pOVar45->m_state = STATE_FINISHED;
      if (local_648 != (float *)0x0) {
        operator_delete(local_648,(long)local_638 - (long)local_648);
      }
      IVar35 = STOP;
      if (local_860 != (float *)0x0) {
        operator_delete(local_860,(long)local_7d0 - (long)local_860);
        IVar35 = STOP;
      }
    }
  }
  else {
    if (SVar11 == STATE_MEASURE) {
      iVar13 = (this->m_calibrator).m_measureState.numDrawCalls;
      dVar15 = deGetMicroseconds();
      render(this,iVar13);
      dVar14 = deGetMicroseconds();
      deqp::gls::TheilSenCalibrator::recordIteration(this_00,dVar14 - dVar15);
    }
    else if (SVar11 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters(this_00);
    }
    SVar11 = deqp::gls::TheilSenCalibrator::getState(this_00);
    IVar35 = CONTINUE;
    if (SVar11 == STATE_FINISHED) {
      deqp::gls::logCalibrationInfo
                (((this->super_TestCase).super_TestNode.m_testCtx)->m_log,this_00);
      afVar2 = (float  [2])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
      if ((this->m_calibrator).m_measureState.numDrawCalls == 1) {
        dVar15 = deqp::gls::MeasureState::getTotalTime(&(this->m_calibrator).m_measureState);
        fVar50 = (this->m_calibrator).m_params.targetFrameTimeUs /
                 ((float)dVar15 /
                 (float)(ulong)((long)(this->m_calibrator).m_measureState.frameTimes.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_calibrator).m_measureState.frameTimes.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
        if (fVar50 < 0.95) {
          CVar1 = this->m_caseType;
          if (fVar50 < 0.0) {
            fVar50 = sqrtf(fVar50);
          }
          else {
            fVar50 = SQRT(fVar50);
          }
          if (CVar1 == CASETYPE_VERTEX) {
            iVar26 = (int)((float)this->m_gridSizeX * fVar50);
            this->m_gridSizeX = iVar26;
            iVar13 = (int)((float)this->m_gridSizeY * fVar50);
            this->m_gridSizeY = iVar13;
            if ((iVar26 < 1) || (iVar13 < 1)) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,"Can\'t decrease grid size enough to achieve low-enough draw times"
                         ,"m_gridSizeX >= 1 && m_gridSizeY >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x371);
              goto LAB_01392973;
            }
            local_538 = (undefined1  [8])afVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,
                       "Note: triangle grid size reduced from original; it\'s now smaller than during calibration."
                       ,0x59);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          else {
            iVar26 = (int)((float)this->m_viewportWidth * fVar50);
            this->m_viewportWidth = iVar26;
            iVar13 = (int)((float)this->m_viewportHeight * fVar50);
            this->m_viewportHeight = iVar13;
            if ((iVar26 < 1) || (iVar13 < 1)) {
              this_02 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_02,
                         "Can\'t decrease viewport size enough to achieve low-enough draw times",
                         "m_viewportWidth >= 1 && m_viewportHeight >= 1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                         ,0x379);
LAB_01392973:
              __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            local_538 = (undefined1  [8])afVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_530,
                       "Note: viewport size reduced from original; it\'s now smaller than during calibration."
                       ,0x54);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
          std::ios_base::~ios_base(local_4c0);
        }
      }
      prepareProgram(this,0);
      local_538 = (undefined1  [8])afVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_530,"Grid size: ",0xb);
      std::ostream::operator<<((ostringstream *)auStack_530,this->m_gridSizeX);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_530,"x",1);
      std::ostream::operator<<((ostringstream *)auStack_530,this->m_gridSizeY);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
      std::ios_base::~ios_base(local_4c0);
      local_538 = (undefined1  [8])afVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_530);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_530,"Viewport: ",10);
      std::ostream::operator<<((ostringstream *)auStack_530,this->m_viewportWidth);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_530,"x",1);
      std::ostream::operator<<((ostringstream *)auStack_530,this->m_viewportHeight);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_538,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_530);
      std::ios_base::~ios_base(local_4c0);
      prepareNextRound(this);
      ((this->m_initialCalibrationStorage).m_ptr)->initialNumCalls =
           (this->m_calibrator).m_measureState.numDrawCalls;
    }
  }
  return IVar35;
}

Assistant:

OperatorPerformanceCase::IterateResult OperatorPerformanceCase::iterate (void)
{
	const TheilSenCalibrator::State calibratorState = m_calibrator.getState();

	if (calibratorState != TheilSenCalibrator::STATE_FINISHED)
	{
		if (calibratorState == TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
			m_calibrator.recomputeParameters();
		else if (calibratorState == TheilSenCalibrator::STATE_MEASURE)
			m_calibrator.recordIteration(renderAndMeasure(m_calibrator.getCallCount()));
		else
			DE_ASSERT(false);

		if (m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
		{
			logCalibrationInfo(m_testCtx.getLog(), m_calibrator);
			adjustAndLogGridAndViewport();
			prepareNextRound();
			m_initialCalibrationStorage->initialNumCalls = m_calibrator.getCallCount();
		}
	}
	else if (m_state == STATE_FIND_HIGH_WORKLOAD || m_state == STATE_MEASURING)
	{
		if (m_workloadMeasurementNdx < m_numMeasurementsPerWorkload)
		{
			vector<WorkloadRecord>& records = m_state == STATE_FIND_HIGH_WORKLOAD ? m_workloadRecordsFindHigh[m_measureProgramNdx] : m_workloadRecords[m_measureProgramNdx];
			records.back().addFrameTime((float)renderAndMeasure(m_calibrator.getCallCount()));
			m_workloadMeasurementNdx++;
		}
		else
			prepareNextRound();
	}
	else
	{
		DE_ASSERT(m_state == STATE_REPORTING);

		TestLog&	log				= m_testCtx.getLog();
		const int	drawCallCount	= m_calibrator.getCallCount();

		{
			// Compute per-program estimators for measurements.
			vector<SegmentedEstimator> estimators;
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
				estimators.push_back(computeSegmentedEstimator(getWorkloadMedianDataPoints(progNdx)));

			// Log measurements and their estimators for all programs.
			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				const SegmentedEstimator&	estimator	= estimators[progNdx];
				const string				progNdxStr	= de::toString(progNdx);
				vector<WorkloadRecord>		records		= m_workloadRecords[progNdx];
				std::sort(records.begin(), records.end());

				{
					const tcu::ScopedLogSection section(log,
														"Program" + progNdxStr + "Measurements",
														"Measurements for program " + progNdxStr);

					// Sample list of individual frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "IndividualFrameTimes", "Individual frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",	"Workload",		"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("FrameTime",	"Frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						for (int j = 0; j < (int)records[i].frameTimes.size(); j++)
							log << TestLog::Sample << records[i].workloadSize << records[i].frameTimes[j] << TestLog::EndSample;

					log << TestLog::EndSampleList;

					// Sample list of median frame times.

					log << TestLog::SampleList("Program" + progNdxStr + "MedianFrameTimes", "Median frame times")
						<< TestLog::SampleInfo << TestLog::ValueInfo("Workload",		"Workload",				"",		QP_SAMPLE_VALUE_TAG_PREDICTOR)
											   << TestLog::ValueInfo("MedianFrameTime",	"Median frame time",	"us",	QP_SAMPLE_VALUE_TAG_RESPONSE)
						<< TestLog::EndSampleInfo;

					for (int i = 0; i < (int)records.size(); i++)
						log << TestLog::Sample << records[i].workloadSize << records[i].getMedianTime() << TestLog::EndSample;

					log << TestLog::EndSampleList;

					log << TestLog::Float("Program" + progNdxStr + "WorkloadCostEstimate", "Workload cost estimate", "us / workload", QP_KEY_TAG_TIME, estimator.right.coefficient);

					if (estimator.pivotX > -std::numeric_limits<float>::infinity())
						log << TestLog::Message << "Note: the data points with x coordinate greater than or equal to " << estimator.pivotX
												<< " seem to form a rising line, and the rest of data points seem to form a near-horizontal line" << TestLog::EndMessage
							<< TestLog::Message << "Note: the left line is estimated to be " << lineParamsString(estimator.left)
												<< " and the right line " << lineParamsString(estimator.right) << TestLog::EndMessage;
					else
						log << TestLog::Message << "Note: the data seem to form a single line: " << lineParamsString(estimator.right) << TestLog::EndMessage;
				}
			}

			for (int progNdx = 0; progNdx < (int)m_programs.size(); progNdx++)
			{
				if (estimators[progNdx].right.coefficient <= 0.0f)
				{
					log << TestLog::Message << "Slope of measurements for program " << progNdx << " isn't positive. Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			// \note For each estimator, .right.coefficient is the increase in draw time (in microseconds) when
			// incrementing shader workload size by 1, when D draw calls are done, with a vertex/fragment count
			// of R.
			//
			// The measurements of any single program can't tell us the final result (time of single operation),
			// so we use computeSingleOperationTime to compute it from multiple programs' measurements in a
			// subclass-defined manner.
			//
			// After that, microseconds per operation can be calculated as singleOperationTime / (D * R).

			{
				vector<float>	perProgramSlopes;
				for (int i = 0; i < (int)m_programs.size(); i++)
					perProgramSlopes.push_back(estimators[i].right.coefficient);

				logSingleOperationCalculationInfo();

				const float		maxSlope				= *std::max_element(perProgramSlopes.begin(), perProgramSlopes.end());
				const float		usecsPerFramePerOp		= computeSingleOperationTime(perProgramSlopes);
				const int		vertexOrFragmentCount	= m_caseType == CASETYPE_VERTEX ?
															getNumVertices(m_gridSizeX, m_gridSizeY) :
															m_viewportWidth*m_viewportHeight;
				const double	usecsPerDrawCallPerOp	= usecsPerFramePerOp / (double)drawCallCount;
				const double	usecsPerSingleOp		= usecsPerDrawCallPerOp / (double)vertexOrFragmentCount;
				const double	megaOpsPerSecond		= (double)(drawCallCount*vertexOrFragmentCount) / usecsPerFramePerOp;
				const int		numFreeOps				= de::max(0, (int)deFloatFloor(intersectionX(estimators[0].left,
																									 LineParameters(estimators[0].right.offset,
																													usecsPerFramePerOp))));

				log << TestLog::Integer("VertexOrFragmentCount",
										"R = " + string(m_caseType == CASETYPE_VERTEX ? "Vertex" : "Fragment") + " count",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount)

					<< TestLog::Integer("DrawCallsPerFrame", "D = Draw calls per frame", "", QP_KEY_TAG_NONE, drawCallCount)

					<< TestLog::Integer("VerticesOrFragmentsPerFrame",
										"R*D = " + string(m_caseType == CASETYPE_VERTEX ? "Vertices" : "Fragments") + " per frame",
										"", QP_KEY_TAG_NONE, vertexOrFragmentCount*drawCallCount)

					<< TestLog::Float("TimePerFramePerOp",
									  "Estimated cost of R*D " + string(m_caseType == CASETYPE_VERTEX ? "vertices" : "fragments")
									  + " (i.e. one frame) with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerFramePerOp)

					<< TestLog::Float("TimePerDrawcallPerOp",
									  "Estimated cost of one draw call with one shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerDrawCallPerOp)

					<< TestLog::Float("TimePerSingleOp",
									  "Estimated cost of a single shader operation",
									  "us", QP_KEY_TAG_TIME, (float)usecsPerSingleOp);

				// \note Sometimes, when the operation is free or very cheap, it can happen that the shader with the operation runs,
				//		 for some reason, a bit faster than the shader without the operation, and thus we get a negative result. The
				//		 following threshold values for accepting a negative or almost-zero result are rather quick and dirty.
				if (usecsPerFramePerOp <= -0.1f*maxSlope)
				{
					log << TestLog::Message << "Got strongly negative result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
				else if (usecsPerFramePerOp <= 0.001*maxSlope)
				{
					log << TestLog::Message << "Cost of operation seems to be approximately zero." << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
				}
				else
				{
					log << TestLog::Float("OpsPerSecond",
										  "Operations per second",
										  "Million/s", QP_KEY_TAG_PERFORMANCE, (float)megaOpsPerSecond)

						<< TestLog::Integer("NumFreeOps",
											"Estimated number of \"free\" operations",
											"", QP_KEY_TAG_PERFORMANCE, numFreeOps);

					m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString((float)megaOpsPerSecond, 2).c_str());
				}

				m_state = STATE_FINISHED;
			}
		}

		return STOP;
	}

	return CONTINUE;
}